

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O1

void __thiscall imrt::Volume::Volume(Volume *this,Collimator *collimator,string *deposition_file)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  string local_38;
  
  this->collimator = collimator;
  p_Var1 = &(this->D)._M_t._M_impl.super__Rb_tree_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar2 = (deposition_file->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar2,pcVar2 + deposition_file->_M_string_length);
  set_data(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

Volume::Volume(Collimator& collimator, string deposition_file) :
		collimator(collimator) {
  set_data(deposition_file);
}